

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O3

void __thiscall Am_Network_Group::Broadcast(Am_Network_Group *this,Am_Object *obj)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Connection *this_00;
  Am_Connection *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Value_List *this_01;
  Am_Assoc b_assoc;
  Am_Assoc local_68;
  Am_Value local_60;
  Am_Value local_50;
  Am_Value local_40;
  
  this_01 = &this->Member_Connections;
  Am_Value_List::Start(this_01);
  bVar1 = Am_Value_List::Last(this_01);
  if (!bVar1) {
    do {
      pAVar2 = Am_Value_List::Get(this_01);
      this_00 = (Am_Connection *)Am_Value::operator_cast_to_void_(pAVar2);
      pAVar2 = Am_Object::Get(obj,Am_NET_BLESSING,1);
      bVar1 = Am_Value::operator!=(pAVar2,&Am_No_Value);
      if (bVar1) {
        Am_Assoc::Am_Assoc(&local_68,pAVar2);
        if (local_68.data == (Am_Assoc_Data *)0x0) {
          Am_Error("Accessing (nullptr) Assoc");
        }
        Am_Value::Am_Value(&local_40,&(local_68.data)->value_1);
        pAVar3 = (Am_Connection *)Am_Value::operator_cast_to_void_(&local_40);
        Am_Value::~Am_Value(&local_40);
        if (pAVar3 != this_00) {
          pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(obj);
          Am_Value::Am_Value(&local_50,pAVar4);
          Am_Connection::Send(this_00,&local_50);
          Am_Value::~Am_Value(&local_50);
        }
        Am_Assoc::~Am_Assoc(&local_68);
      }
      else {
        pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(obj);
        Am_Value::Am_Value(&local_60,pAVar4);
        Am_Connection::Send(this_00,&local_60);
        Am_Value::~Am_Value(&local_60);
      }
      Am_Value_List::Next(this_01);
      bVar1 = Am_Value_List::Last(this_01);
    } while (!bVar1);
  }
  return;
}

Assistant:

void
Am_Network_Group::Broadcast(Am_Object obj)
{
  Am_Ptr mistyped_ptr;
  Am_Connection *conn_ptr;
  uintptr_t conn_id, bless_id;
  for (Member_Connections.Start(); !(Member_Connections.Last());
       Member_Connections.Next()) {
    mistyped_ptr = Member_Connections.Get();
    conn_ptr = (Am_Connection *)mistyped_ptr;
    const Am_Value& b_val = obj.Peek(Am_NET_BLESSING);
    if (b_val != Am_No_Value) {
      Am_Assoc b_assoc = b_val;
      Am_Ptr b_ptr = b_assoc.Value_1();
      bless_id = (uintptr_t)b_ptr;
      conn_id = (uintptr_t)conn_ptr;
      if (bless_id != conn_id) {
        conn_ptr->Send((Am_Value)obj);
      } else {
      }
    } else {
      conn_ptr->Send((Am_Value)obj);
    }
  }
}